

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void slang::ast::NetSymbol::fromSyntax
               (Scope *scope,NetDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::NetSymbol_*> *results)

{
  bool bVar1;
  Compilation *this;
  DeclaratorSyntax *pDVar2;
  SourceLocation this_00;
  NetSymbol *__range;
  long in_RSI;
  Scope *in_RDI;
  string_view syntax_00;
  NetSymbol *net;
  DeclaratorSyntax *declarator;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  ExpansionHint expansionHint;
  NetType *netType;
  Compilation *comp;
  Compilation *in_stack_ffffffffffffff48;
  NetSymbol *in_stack_ffffffffffffff50;
  Scope *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  short sVar3;
  SourceLocation *in_stack_ffffffffffffff70;
  Scope *in_stack_ffffffffffffff78;
  ExpansionHint local_2c;
  undefined8 in_stack_ffffffffffffffd8;
  TokenKind kind;
  
  kind = (TokenKind)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  this = Scope::getCompilation(in_RDI);
  Compilation::getNetType(this,kind);
  local_2c = None;
  sVar3 = *(short *)(in_RSI + 0x68);
  if (sVar3 == 0x111) {
    local_2c = Scalared;
  }
  else if (sVar3 == 0x144) {
    local_2c = Vectored;
  }
  slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x53740d);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x537424);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                           ((self_type *)in_stack_ffffffffffffff50,
                            (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                            in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff48 = this;
    pDVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0x537452);
    this = in_stack_ffffffffffffff48;
    syntax_00 = parsing::Token::valueText((Token *)in_stack_ffffffffffffff60);
    this_00 = parsing::Token::location(&pDVar2->name);
    __range = BumpAllocator::
              emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                        ((BumpAllocator *)this_00,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         (NetType *)CONCAT26(sVar3,in_stack_ffffffffffffff68));
    __range->expansionHint = local_2c;
    in_stack_ffffffffffffff50 = __range;
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x5374db);
    ValueSymbol::setDeclaredType
              (&in_stack_ffffffffffffff50->super_ValueSymbol,
               (DataTypeSyntax *)in_stack_ffffffffffffff48);
    ValueSymbol::setFromDeclarator
              (&in_stack_ffffffffffffff50->super_ValueSymbol,
               (DeclaratorSyntax *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff60 = in_RDI;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_RDI,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__range);
    Symbol::setAttributes
              ((Symbol *)this_00,in_stack_ffffffffffffff78,
               (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>)
               syntax_00);
    SmallVectorBase<const_slang::ast::NetSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::NetSymbol_*> *)in_stack_ffffffffffffff50,
               (NetSymbol **)in_stack_ffffffffffffff48);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void NetSymbol::fromSyntax(const Scope& scope, const NetDeclarationSyntax& syntax,
                           SmallVectorBase<const NetSymbol*>& results) {
    auto& comp = scope.getCompilation();
    const NetType& netType = comp.getNetType(syntax.netType.kind);

    ExpansionHint expansionHint = ExpansionHint::None;
    switch (syntax.expansionHint.kind) {
        case TokenKind::VectoredKeyword:
            expansionHint = ExpansionHint::Vectored;
            break;
        case TokenKind::ScalaredKeyword:
            expansionHint = ExpansionHint::Scalared;
            break;
        default:
            break;
    }

    for (auto declarator : syntax.declarators) {
        auto net = comp.emplace<NetSymbol>(declarator->name.valueText(),
                                           declarator->name.location(), netType);
        net->expansionHint = expansionHint;
        net->setDeclaredType(*syntax.type);
        net->setFromDeclarator(*declarator);
        net->setAttributes(scope, syntax.attributes);
        results.push_back(net);
    }
}